

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

bool __thiscall llvm::Twine::isSingleStringRef(Twine *this)

{
  NodeKind NVar1;
  Twine *this_local;
  
  NVar1 = getRHSKind(this);
  if (NVar1 == EmptyKind) {
    NVar1 = getLHSKind(this);
    if ((NVar1 == EmptyKind) || (NVar1 - 3 < 4)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool isSingleStringRef() const {
      if (getRHSKind() != EmptyKind) return false;

      switch (getLHSKind()) {
      case EmptyKind:
      case CStringKind:
      case StdStringKind:
      case StringRefKind:
      case SmallStringKind:
        return true;
      default:
        return false;
      }
    }